

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O3

matrix<trng::GF2,_521UL> *
trng::operator*(matrix<trng::GF2,_521UL> *__return_storage_ptr__,matrix<trng::GF2,_521UL> *a,
               matrix<trng::GF2,_521UL> *b)

{
  long lVar1;
  pointer pGVar2;
  pointer __s;
  pointer pGVar3;
  pointer pGVar4;
  ulong uVar5;
  size_type j_end;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  pointer pGVar11;
  pointer pGVar12;
  size_type i;
  pointer pGVar13;
  ulong uVar14;
  size_type j0;
  ulong uVar15;
  pointer pGVar16;
  byte bVar17;
  bool bVar18;
  pointer local_68;
  
  __s = (pointer)operator_new(0x42451);
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x42451;
  lVar9 = 0;
  memset(__s,0,0x42451);
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x42451;
  pGVar2 = (a->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar16 = (b->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar15 = 0;
  local_68 = __s;
  do {
    uVar5 = 0x1e9;
    if (uVar15 < 0x1e9) {
      uVar5 = uVar15;
    }
    uVar6 = uVar5 + 0x20;
    lVar7 = -0x42451;
    do {
      if (uVar15 < uVar6) {
        memset(local_68 + lVar7 + 0x42451,0,uVar5 + lVar9 * -0x20 + 0x20);
      }
      lVar7 = lVar7 + 0x209;
    } while (lVar7 != 0);
    pGVar4 = pGVar16;
    uVar5 = 0;
    pGVar12 = pGVar2;
    do {
      uVar10 = 0x1e9;
      if (uVar5 < 0x1e9) {
        uVar10 = uVar5;
      }
      lVar7 = 0;
      pGVar11 = pGVar12;
      do {
        if (uVar15 < uVar6) {
          pGVar3 = pGVar4;
          uVar14 = uVar15;
          do {
            if (uVar5 < uVar10 + 0x20) {
              lVar8 = 0;
              bVar17 = 0;
              pGVar13 = pGVar3;
              do {
                bVar17 = bVar17 ^ pGVar13->value & pGVar11[lVar8].value;
                lVar1 = uVar5 + lVar8;
                lVar8 = lVar8 + 1;
                pGVar13 = pGVar13 + 0x209;
              } while (lVar1 + 1U < uVar10 + 0x20);
            }
            else {
              bVar17 = 0;
            }
            __s[uVar14 + lVar7 * 0x209].value = __s[uVar14 + lVar7 * 0x209].value ^ bVar17;
            uVar14 = uVar14 + 1;
            pGVar3 = pGVar3 + 1;
          } while (uVar14 < uVar6);
        }
        lVar7 = lVar7 + 1;
        pGVar11 = pGVar11 + 0x209;
      } while (lVar7 != 0x209);
      pGVar12 = pGVar12 + 0x20;
      pGVar4 = pGVar4 + 0x4120;
      bVar18 = uVar5 < 0x1e9;
      uVar5 = uVar5 + 0x20;
    } while (bVar18);
    uVar15 = uVar15 + 0x20;
    lVar9 = lVar9 + 1;
    local_68 = local_68 + 0x20;
    pGVar16 = pGVar16 + 0x20;
  } while (lVar9 != 0x11);
  return __return_storage_ptr__;
}

Assistant:

matrix<T, n> operator*(const matrix<T, n> &a, const matrix<T, n> &b) {
    using size_type = typename matrix<T, n>::size_type;
    matrix<T, n> res;
    const size_type step{32};
    for (size_type j0{0}; j0 < n; j0 += step) {
      for (size_type i{0}; i < n; ++i)
        for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j)
          res(i, j) = T{0};
      for (size_type k0{0}; k0 < n; k0 += step) {
        for (size_type i{0}; i < n; ++i)
          for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j) {
            T sum{0};
            for (size_type k{k0}, k_end{utility::min(n, k0 + step)}; k < k_end; ++k)
              sum = sum + a(i, k) * b(k, j);
            res(i, j) = res(i, j) + sum;
          }
      }
    }
    return res;
  }